

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCppFile.h
# Opt level: O2

string * __thiscall
cppforth::Forth::GetFileName
          (string *__return_storage_ptr__,Forth *this,Cell handler,string *function,errorCodes ec)

{
  pointer pFVar1;
  char cVar2;
  undefined8 uVar3;
  pointer pFVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pFVar4 = (this->OpenFiles).
           super__Vector_base<cppforth::Forth::ForthFile,_std::allocator<cppforth::Forth::ForthFile>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pFVar1 = (this->OpenFiles).
           super__Vector_base<cppforth::Forth::ForthFile,_std::allocator<cppforth::Forth::ForthFile>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pFVar4 == pFVar1) {
      std::operator+(&local_50,function,": wrong file handler access");
      throwMessage(this,&local_50,ec);
      std::__cxx11::string::~string((string *)&local_50);
      uVar3 = __cxa_rethrow();
      std::__cxx11::string::~string((string *)&local_50);
      _Unwind_Resume(uVar3);
    }
    if (pFVar4->FILE == handler) {
      cVar2 = std::__basic_file<char>::is_open();
      if (cVar2 != '\0') {
        std::__cxx11::string::string((string *)__return_storage_ptr__,&pFVar4->fileName);
        return __return_storage_ptr__;
      }
    }
    pFVar4 = pFVar4 + 1;
  } while( true );
}

Assistant:

std::string GetFileName(Cell handler, const std::string& function, errorCodes ec = errorAbort) {
	for (auto it = OpenFiles.begin(); it != OpenFiles.end(); ++it) {
		if ((*it).FILE == handler && (*it).fileObject->is_open()) {
			return (*it).fileName;
		}
	}
	throwMessage(function + ": wrong file handler access", ec);
	throw;
}